

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O0

void locale_utility_init(UErrorCode *status)

{
  UBool UVar1;
  Hashtable *pHVar2;
  code *p;
  Hashtable *local_30;
  UErrorCode *status_local;
  
  p = service_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_SERVICE,service_cleanup);
  pHVar2 = (Hashtable *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)p);
  local_30 = (Hashtable *)0x0;
  if (pHVar2 != (Hashtable *)0x0) {
    p = (code *)status;
    icu_63::Hashtable::Hashtable(pHVar2,status);
    local_30 = pHVar2;
  }
  LocaleUtility_cache = local_30;
  UVar1 = U_FAILURE(*status);
  pHVar2 = LocaleUtility_cache;
  if (UVar1 == '\0') {
    if (LocaleUtility_cache == (Hashtable *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      icu_63::Hashtable::setValueDeleter(LocaleUtility_cache,uhash_deleteHashtable_63);
    }
  }
  else {
    if (LocaleUtility_cache != (Hashtable *)0x0) {
      icu_63::Hashtable::~Hashtable(LocaleUtility_cache);
      icu_63::UMemory::operator_delete((UMemory *)pHVar2,p);
    }
    LocaleUtility_cache = (Hashtable *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV locale_utility_init(UErrorCode &status) {
    using namespace icu;
    U_ASSERT(LocaleUtility_cache == NULL);
    ucln_common_registerCleanup(UCLN_COMMON_SERVICE, service_cleanup);
    LocaleUtility_cache = new Hashtable(status);
    if (U_FAILURE(status)) {
        delete LocaleUtility_cache;
        LocaleUtility_cache = NULL;
        return;
    }
    if (LocaleUtility_cache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    LocaleUtility_cache->setValueDeleter(uhash_deleteHashtable);
}